

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

int __thiscall ncnn::ParamDict::load_param(ParamDict *this,uchar **mem)

{
  uint uVar1;
  uint *puVar2;
  int *piVar3;
  Allocator *pAVar4;
  uchar *puVar5;
  void *pvVar6;
  void *pvVar7;
  uint *puVar8;
  uint *puVar9;
  uint uVar10;
  Mat *pMVar11;
  size_t sVar12;
  size_t __n;
  
  clear(this);
  puVar2 = (uint *)*mem;
  uVar1 = *puVar2;
  puVar9 = puVar2 + 1;
  *mem = (uchar *)puVar9;
  while (uVar1 != 0xffffff17) {
    uVar10 = -(uVar1 + 0x5b04);
    if ((int)uVar1 < -0x5b03) {
      uVar1 = *puVar9;
      sVar12 = (size_t)(int)uVar1;
      *mem = (uchar *)(puVar2 + 2);
      pMVar11 = &this->params[uVar10].v;
      if ((((this->params[uVar10].v.dims != 1) || (this->params[uVar10].v.w != uVar1)) ||
          (this->params[uVar10].v.elemsize != 4)) ||
         (this->params[uVar10].v.allocator != (Allocator *)0x0)) {
        piVar3 = this->params[uVar10].v.refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            pAVar4 = this->params[uVar10].v.allocator;
            if (pAVar4 == (Allocator *)0x0) {
              if (pMVar11->data != (void *)0x0) {
                free(*(void **)((long)pMVar11->data + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar4 + 8))();
            }
          }
        }
        pMVar11->data = (void *)0x0;
        this->params[uVar10].v.refcount = (int *)0x0;
        this->params[uVar10].v.elemsize = 4;
        this->params[uVar10].v.allocator = (Allocator *)0x0;
        this->params[uVar10].v.dims = 1;
        this->params[uVar10].v.w = uVar1;
        this->params[uVar10].v.h = 1;
        this->params[uVar10].v.c = 1;
        this->params[uVar10].v.cstep = sVar12;
        if (uVar1 != 0) {
          pvVar6 = malloc(sVar12 * 4 + 0x1c);
          pvVar7 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
          *(void **)((long)pvVar7 - 8) = pvVar6;
          pMVar11->data = pvVar7;
          piVar3 = (int *)((long)pvVar7 + sVar12 * 4);
          this->params[uVar10].v.refcount = piVar3;
          *piVar3 = 1;
        }
      }
      __n = sVar12 << 2;
      memcpy(pMVar11->data,*mem,__n);
      uVar1 = uVar10;
    }
    else {
      this->params[(int)uVar1].field_1.i = *puVar9;
      __n = 4;
    }
    puVar5 = *mem;
    puVar2 = (uint *)(puVar5 + __n);
    this->params[(int)uVar1].loaded = 1;
    puVar8 = (uint *)(puVar5 + __n);
    puVar9 = puVar8 + 1;
    uVar1 = *puVar8;
    *mem = (uchar *)puVar9;
  }
  return 0;
}

Assistant:

int ParamDict::load_param(const unsigned char*& mem)
{
    clear();

    int id = *(int*)(mem);
    mem += 4;

    while (id != -233)
    {
        bool is_array = id <= -23300;
        if (is_array)
        {
            id = -id - 23300;
        }

        if (is_array)
        {
            int len = *(int*)(mem);
            mem += 4;

            params[id].v.create(len);

            memcpy(params[id].v.data, mem, len * 4);
            mem += len * 4;
        }
        else
        {
            params[id].f = *(float*)(mem);
            mem += 4;
        }

        params[id].loaded = 1;

        id = *(int*)(mem);
        mem += 4;
    }

    return 0;
}